

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  float fVar1;
  ImVec2 IVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = corner_target->x;
  fVar1 = corner_target->y;
  fVar3 = (window->Pos).x;
  fVar7 = (window->Pos).y;
  fVar6 = (fVar3 - fVar8) * corner_norm->x + fVar8;
  fVar3 = fVar3 + (window->Size).x;
  fVar5 = fVar7 + (window->Size).y;
  fVar7 = (fVar7 - fVar1) * corner_norm->y + fVar1;
  fVar8 = ((fVar8 - fVar3) * corner_norm->x + fVar3) - fVar6;
  IVar2.y = fVar7;
  IVar2.x = fVar6;
  fVar7 = ((fVar1 - fVar5) * corner_norm->y + fVar5) - fVar7;
  IVar4.y = fVar7;
  IVar4.x = fVar8;
  IVar4 = CalcWindowSizeAfterConstraint(window,IVar4);
  *out_pos = IVar2;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (IVar4.x - fVar8);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    out_pos->y = out_pos->y - (IVar4.y - fVar7);
  }
  *out_size = IVar4;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}